

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImGuiNavMoveResult *pIVar1;
  int *piVar2;
  ImVec2 *pIVar3;
  double dVar4;
  ImGuiContextHook *pIVar5;
  char *pcVar6;
  uint *puVar7;
  ImGuiViewportP *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiPopupData *pIVar10;
  ImGuiGroupData *pIVar11;
  undefined1 auVar12 [12];
  byte bVar13;
  ImGuiContext *pIVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  ImGuiID IVar19;
  int iVar20;
  ImGuiContext *g_7;
  ulong uVar21;
  uint *__dest;
  ImGuiWindow *pIVar22;
  ImGuiContext *pIVar23;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar24;
  int *piVar25;
  ImGuiGroupData *__dest_02;
  ImGuiID IVar26;
  ImGuiInputSource IVar27;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar28;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDir IVar29;
  float *pfVar30;
  long lVar31;
  ImGuiNavLayer IVar32;
  ImFont *font;
  float *pfVar33;
  long lVar34;
  bool *pbVar35;
  ImGuiWindow *old_nav_window;
  ImGuiContext *g_2;
  ImGuiContext *g_1;
  long lVar36;
  long lVar37;
  ImGuiNavMoveResult *pIVar38;
  ImGuiContext *pIVar39;
  ImGuiContext *g_4;
  ulong uVar40;
  ImGuiContext *pIVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  byte bVar45;
  uint uVar46;
  float fVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  ImVec2 IVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ImRect local_48;
  
  pIVar14 = GImGui;
  bVar45 = 0;
  uVar21 = (ulong)(GImGui->Hooks).Size;
  if (0 < (long)uVar21) {
    lVar36 = -uVar21;
    uVar40 = uVar21 + 1;
    lVar37 = uVar21 * 0x20;
    do {
      pIVar5 = (pIVar14->Hooks).Data;
      if (*(int *)(pIVar5 + lVar37 + -0x1c) == 7) {
        memmove(pIVar5 + lVar37 + -0x20,pIVar5 + lVar37,((int)uVar21 + lVar36) * 0x20);
        uVar17 = (pIVar14->Hooks).Size - 1;
        uVar21 = (ulong)uVar17;
        (pIVar14->Hooks).Size = uVar17;
      }
      lVar36 = lVar36 + 1;
      uVar40 = uVar40 - 1;
      lVar37 = lVar37 + -0x20;
    } while (1 < uVar40);
    if (0 < (int)uVar21) {
      lVar37 = 0;
      lVar36 = 0;
      do {
        pIVar5 = (pIVar14->Hooks).Data;
        if (*(int *)(pIVar5 + lVar37 + 4) == 0) {
          (**(code **)(pIVar5 + lVar37 + 0x10))();
          uVar21 = (ulong)(uint)(pIVar14->Hooks).Size;
        }
        lVar36 = lVar36 + 1;
        lVar37 = lVar37 + 0x20;
      } while (lVar36 < (int)uVar21);
    }
  }
  pIVar39 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar39->SettingsLoaded == false) {
    pcVar6 = (pIVar39->IO).IniFilename;
    if (pcVar6 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar6);
    }
    pIVar39->SettingsLoaded = true;
  }
  if ((0.0 < pIVar39->SettingsDirtyTimer) &&
     (fVar47 = pIVar39->SettingsDirtyTimer - (pIVar39->IO).DeltaTime,
     pIVar39->SettingsDirtyTimer = fVar47, fVar47 <= 0.0)) {
    pcVar6 = (pIVar39->IO).IniFilename;
    if (pcVar6 == (char *)0x0) {
      (pIVar39->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar6);
    }
    pIVar39->SettingsDirtyTimer = 0.0;
  }
  fVar47 = (pIVar14->IO).DeltaTime;
  pIVar14->Time = (double)fVar47 + pIVar14->Time;
  pIVar14->WithinFrameScope = true;
  pIVar14->FrameCount = pIVar14->FrameCount + 1;
  pIVar14->TooltipOverrideCount = 0;
  pIVar14->WindowsActiveCount = 0;
  if ((pIVar14->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar7 = (pIVar14->MenusIdSubmittedThisFrame).Data;
    if (puVar7 != (uint *)0x0) {
      memcpy(__dest,puVar7,(long)(pIVar14->MenusIdSubmittedThisFrame).Size << 2);
      puVar7 = (pIVar14->MenusIdSubmittedThisFrame).Data;
      if ((puVar7 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar25 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar25 = *piVar25 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
    }
    (pIVar14->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar14->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar47 = (pIVar14->IO).DeltaTime;
  }
  pIVar39 = GImGui;
  (pIVar14->MenusIdSubmittedThisFrame).Size = 0;
  iVar20 = pIVar14->FramerateSecPerFrameIdx;
  pIVar14->FramerateSecPerFrameAccum =
       (fVar47 - pIVar14->FramerateSecPerFrame[iVar20]) + pIVar14->FramerateSecPerFrameAccum;
  pIVar14->FramerateSecPerFrame[iVar20] = fVar47;
  iVar18 = iVar20 + (int)((ulong)((long)(iVar20 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar14->FramerateSecPerFrameIdx = iVar20 + 1 + ((iVar18 >> 6) - (iVar18 >> 0x1f)) * -0x78;
  uVar17 = -(uint)(0.0 < pIVar14->FramerateSecPerFrameAccum);
  (pIVar14->IO).Framerate =
       (float)(~uVar17 & 0x7f7fffff |
              (uint)(1.0 / (pIVar14->FramerateSecPerFrameAccum / 120.0)) & uVar17);
  pIVar8 = *(pIVar39->Viewports).Data;
  (pIVar8->super_ImGuiViewport).Flags = 5;
  (pIVar8->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar8->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar8->super_ImGuiViewport).Size = (pIVar39->IO).DisplaySize;
  if (0 < (pIVar39->Viewports).Size) {
    lVar37 = 0;
    do {
      pIVar8 = (pIVar39->Viewports).Data[lVar37];
      pIVar8->WorkOffsetMin = pIVar8->CurrWorkOffsetMin;
      pIVar8->WorkOffsetMax = pIVar8->CurrWorkOffsetMax;
      (pIVar8->CurrWorkOffsetMin).x = 0.0;
      (pIVar8->CurrWorkOffsetMin).y = 0.0;
      (pIVar8->CurrWorkOffsetMax).x = 0.0;
      (pIVar8->CurrWorkOffsetMax).y = 0.0;
      ImGuiViewportP::UpdateWorkRect(pIVar8);
      lVar37 = lVar37 + 1;
    } while (lVar37 < (pIVar39->Viewports).Size);
  }
  ((pIVar14->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar37 = (long)(pIVar14->Viewports).Size;
  if (lVar37 < 1) {
    fVar47 = 3.4028235e+38;
    fVar55 = 3.4028235e+38;
    fVar56 = -3.4028235e+38;
    fVar59 = -3.4028235e+38;
  }
  else {
    fVar47 = 3.4028235e+38;
    fVar55 = 3.4028235e+38;
    fVar56 = -3.4028235e+38;
    fVar59 = -3.4028235e+38;
    lVar36 = 0;
    do {
      pIVar8 = (pIVar14->Viewports).Data[lVar36];
      fVar54 = (pIVar8->super_ImGuiViewport).Pos.x;
      if (fVar54 < fVar47) {
        fVar47 = fVar54;
      }
      fVar52 = (pIVar8->super_ImGuiViewport).Pos.y;
      if (fVar52 < fVar55) {
        fVar55 = fVar52;
      }
      fVar54 = fVar54 + (pIVar8->super_ImGuiViewport).Size.x;
      if (fVar56 < fVar54) {
        fVar56 = fVar54;
      }
      fVar52 = fVar52 + (pIVar8->super_ImGuiViewport).Size.y;
      if (fVar59 < fVar52) {
        fVar59 = fVar52;
      }
      lVar36 = lVar36 + 1;
    } while (lVar37 != lVar36);
  }
  (pIVar14->DrawListSharedData).ClipRectFullscreen.x = fVar47;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.y = fVar55;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.z = fVar56;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.w = fVar59;
  fVar47 = (pIVar14->Style).CircleSegmentMaxError;
  (pIVar14->DrawListSharedData).CurveTessellationTol = (pIVar14->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar14->DrawListSharedData,fVar47);
  bVar42 = (pIVar14->Style).AntiAliasedLines;
  uVar17 = (uint)bVar42;
  (pIVar14->DrawListSharedData).InitialFlags = (uint)bVar42;
  if (((pIVar14->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar14->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar17 = bVar42 | 2;
    (pIVar14->DrawListSharedData).InitialFlags = uVar17;
  }
  if ((pIVar14->Style).AntiAliasedFill == true) {
    uVar17 = uVar17 | 4;
    (pIVar14->DrawListSharedData).InitialFlags = uVar17;
  }
  if (((pIVar14->IO).BackendFlags & 8) != 0) {
    (pIVar14->DrawListSharedData).InitialFlags = uVar17 | 8;
  }
  if (0 < (pIVar14->Viewports).Size) {
    lVar37 = 0;
    do {
      pIVar8 = (pIVar14->Viewports).Data[lVar37];
      (pIVar8->DrawDataP).DisplaySize.x = 0.0;
      (pIVar8->DrawDataP).DisplaySize.y = 0.0;
      (pIVar8->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar8->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar8->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar8->DrawDataP).DisplayPos.x = 0.0;
      (pIVar8->DrawDataP).DisplayPos.y = 0.0;
      (pIVar8->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar8->DrawDataP).field_0x1 = 0;
      (pIVar8->DrawDataP).CmdListsCount = 0;
      (pIVar8->DrawDataP).TotalIdxCount = 0;
      (pIVar8->DrawDataP).TotalVtxCount = 0;
      lVar37 = lVar37 + 1;
    } while (lVar37 < (pIVar14->Viewports).Size);
  }
  pIVar39 = GImGui;
  if ((pIVar14->DragDropActive != false) &&
     (IVar26 = (pIVar14->DragDropPayload).SourceId, IVar26 == pIVar14->ActiveId)) {
    if (GImGui->ActiveId == IVar26) {
      GImGui->ActiveIdIsAlive = IVar26;
    }
    if (pIVar39->ActiveIdPreviousFrame == IVar26) {
      pIVar39->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar14->HoveredIdPreviousFrame == 0) {
    IVar26 = pIVar14->HoveredId;
    pIVar14->HoveredIdTimer = 0.0;
    pIVar14->HoveredIdNotActiveTimer = 0.0;
    if (IVar26 != 0) goto LAB_0011a6fa;
LAB_0011a721:
    IVar26 = 0;
    IVar19 = pIVar14->ActiveId;
  }
  else {
    IVar26 = pIVar14->HoveredId;
    if (IVar26 == 0) goto LAB_0011a721;
    if (pIVar14->ActiveId == IVar26) {
      pIVar14->HoveredIdNotActiveTimer = 0.0;
    }
LAB_0011a6fa:
    fVar47 = (pIVar14->IO).DeltaTime;
    pIVar14->HoveredIdTimer = pIVar14->HoveredIdTimer + fVar47;
    IVar19 = IVar26;
    if (pIVar14->ActiveId != IVar26) {
      pIVar14->HoveredIdNotActiveTimer = fVar47 + pIVar14->HoveredIdNotActiveTimer;
      IVar19 = pIVar14->ActiveId;
    }
  }
  pIVar14->HoveredIdPreviousFrame = IVar26;
  pIVar14->HoveredIdPreviousFrameUsingMouseWheel = pIVar14->HoveredIdUsingMouseWheel;
  pIVar14->HoveredId = 0;
  pIVar14->HoveredIdAllowOverlap = false;
  pIVar14->HoveredIdUsingMouseWheel = false;
  pIVar14->HoveredIdDisabled = false;
  if (((pIVar14->ActiveIdIsAlive != IVar19) && (IVar19 != 0)) &&
     (pIVar14->ActiveIdPreviousFrame == IVar19)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar19 = pIVar14->ActiveId;
  }
  fVar47 = (pIVar14->IO).DeltaTime;
  if (IVar19 != 0) {
    pIVar14->ActiveIdTimer = pIVar14->ActiveIdTimer + fVar47;
  }
  pIVar14->LastActiveIdTimer = pIVar14->LastActiveIdTimer + fVar47;
  pIVar14->ActiveIdPreviousFrame = IVar19;
  pIVar14->ActiveIdPreviousFrameWindow = pIVar14->ActiveIdWindow;
  pIVar14->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar14->ActiveIdHasBeenEditedBefore;
  pIVar14->ActiveIdIsAlive = 0;
  pIVar14->ActiveIdHasBeenEditedThisFrame = false;
  pIVar14->ActiveIdPreviousFrameIsAlive = false;
  pIVar14->ActiveIdIsJustActivated = false;
  if (pIVar14->TempInputId == 0) {
LAB_0011a811:
    if (IVar19 == 0) {
      pIVar14->ActiveIdUsingNavDirMask = 0;
      pIVar14->ActiveIdUsingNavInputMask = 0;
      pIVar14->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar19 != pIVar14->TempInputId) {
    pIVar14->TempInputId = 0;
    goto LAB_0011a811;
  }
  pIVar14->DragDropAcceptIdPrev = pIVar14->DragDropAcceptIdCurr;
  pIVar14->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar14->DragDropAcceptIdCurr = 0;
  pIVar14->DragDropWithinSource = false;
  pIVar14->DragDropWithinTarget = false;
  pIVar14->DragDropHoldJustPressedId = 0;
  pIVar39 = GImGui;
  bVar42 = (GImGui->IO).KeyCtrl;
  uVar17 = bVar42 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar17 = (uint)bVar42;
  }
  uVar46 = uVar17 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar46 = uVar17;
  }
  uVar17 = uVar46 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar17 = uVar46;
  }
  (pIVar14->IO).KeyMods = uVar17;
  memcpy((pIVar14->IO).KeysDownDurationPrev,(pIVar14->IO).KeysDownDuration,0x800);
  lVar37 = 0x144;
  do {
    fVar55 = -1.0;
    if (*(char *)((long)(pIVar14->IO).KeyMap + lVar37 + -0x3c) == '\x01') {
      fVar56 = *(float *)((long)pIVar14 + lVar37 * 4 + -0x70);
      fVar55 = 0.0;
      if (0.0 <= fVar56) {
        fVar55 = fVar56 + fVar47;
      }
    }
    *(float *)((long)pIVar14 + lVar37 * 4 + -0x70) = fVar55;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x344);
  (pIVar39->IO).WantSetMousePos = false;
  pIVar39->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar39->NavWrapRequestFlags = 0;
  uVar17 = (pIVar39->IO).ConfigFlags;
  if (((uVar17 & 2) == 0) || (((pIVar39->IO).BackendFlags & 1) == 0)) {
    bVar13 = 0;
  }
  else {
    bVar13 = 1;
    if ((pIVar39->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((0.0 < (pIVar39->IO).NavInputs[0] || (0.0 < (pIVar39->IO).NavInputs[2])) ||
        ((0.0 < (pIVar39->IO).NavInputs[1] ||
         ((((0.0 < (pIVar39->IO).NavInputs[3] || (0.0 < (pIVar39->IO).NavInputs[4])) ||
           (0.0 < (pIVar39->IO).NavInputs[5])) ||
          ((0.0 < (pIVar39->IO).NavInputs[6] || (0.0 < (pIVar39->IO).NavInputs[7])))))))))) {
      pIVar39->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar17 & 1) != 0) {
    lVar37 = (long)(pIVar39->IO).KeyMap[0xc];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[0] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[0xd];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[2] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[0xe];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[1] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[1];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[0x11] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[2];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[0x12] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[3];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[0x13] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar37 = (long)(pIVar39->IO).KeyMap[4];
    if ((-1 < lVar37) && ((pIVar39->IO).KeysDown[lVar37] == true)) {
      (pIVar39->IO).NavInputs[0x14] = 1.0;
      pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar42 = (pIVar39->IO).KeyCtrl;
    if (bVar42 == true) {
      (pIVar39->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar39->IO).KeyShift == true) {
      (pIVar39->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar42 == false) && ((pIVar39->IO).KeyAlt != false)) {
      (pIVar39->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar30 = (pIVar39->IO).NavInputsDownDuration;
  pfVar33 = (pIVar39->IO).NavInputsDownDurationPrev;
  for (lVar37 = 0x15; lVar37 != 0; lVar37 = lVar37 + -1) {
    *pfVar33 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar45 * -2 + 1;
    pfVar33 = pfVar33 + (ulong)bVar45 * -2 + 1;
  }
  lVar37 = 0x528;
  do {
    fVar47 = -1.0;
    if (0.0 < *(float *)((long)pIVar39 + lVar37 * 4 + -0x115c)) {
      fVar55 = (float)(pIVar39->IO).KeyMap[lVar37 + -0xf];
      fVar47 = 0.0;
      if (0.0 <= fVar55) {
        fVar47 = fVar55 + (pIVar39->IO).DeltaTime;
      }
    }
    (pIVar39->IO).KeyMap[lVar37 + -0xf] = (int)fVar47;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x53d);
  IVar26 = pIVar39->NavInitResultId;
  if ((IVar26 != 0) &&
     (((pIVar39->NavDisableHighlight != true || (pIVar39->NavInitRequestFromMove == true)) &&
      (pIVar22 = pIVar39->NavWindow, pIVar22 != (ImGuiWindow *)0x0)))) {
    IVar32 = pIVar39->NavLayer;
    if (pIVar39->NavInitRequestFromMove == true) {
      pIVar39->NavId = IVar26;
      pIVar39->NavFocusScopeId = 0;
      pIVar22->NavLastIds[(int)IVar32] = IVar26;
      IVar48 = (pIVar39->NavInitResultRectRel).Max;
      pIVar22->NavRectRel[(int)IVar32].Min = (pIVar39->NavInitResultRectRel).Min;
      (&pIVar22->NavRectRel[(int)IVar32].Min)[1] = IVar48;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
      pIVar22 = pIVar39->NavWindow;
      IVar32 = pIVar39->NavLayer;
    }
    else {
      pIVar39->NavId = IVar26;
      pIVar39->NavFocusScopeId = 0;
      pIVar22->NavLastIds[(int)IVar32] = IVar26;
    }
    IVar48 = (pIVar39->NavInitResultRectRel).Max;
    pIVar22->NavRectRel[IVar32].Min = (pIVar39->NavInitResultRectRel).Min;
    (&pIVar22->NavRectRel[IVar32].Min)[1] = IVar48;
  }
  pIVar39->NavInitRequest = false;
  pIVar39->NavInitRequestFromMove = false;
  pIVar39->NavInitResultId = 0;
  pIVar39->NavJustMovedToId = 0;
  pIVar41 = pIVar39;
  if (pIVar39->NavMoveRequest == true) {
    IVar26 = (pIVar39->NavMoveResultLocal).ID;
    if ((IVar26 == 0) && ((pIVar39->NavMoveResultOther).ID == 0)) {
      if (pIVar39->NavId == 0) goto LAB_0011ae58;
    }
    else {
      pIVar1 = &pIVar39->NavMoveResultOther;
      pIVar38 = &pIVar39->NavMoveResultLocal;
      if (IVar26 == 0) {
        pIVar38 = pIVar1;
      }
      if ((((pIVar39->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar26 = (pIVar39->NavMoveResultLocalVisibleSet).ID, IVar26 != 0)) &&
         (IVar26 != pIVar39->NavId)) {
        pIVar38 = &pIVar39->NavMoveResultLocalVisibleSet;
      }
      if (pIVar38 == pIVar1) {
LAB_0011ad39:
        pIVar38 = pIVar1;
      }
      else if (((pIVar39->NavMoveResultOther).ID != 0) &&
              (((pIVar39->NavMoveResultOther).Window)->ParentWindow == pIVar39->NavWindow)) {
        fVar47 = (pIVar39->NavMoveResultOther).DistBox;
        fVar55 = pIVar38->DistBox;
        if (fVar55 <= fVar47) {
          if (((fVar47 != fVar55) || (NAN(fVar47) || NAN(fVar55))) ||
             (pfVar30 = &(pIVar39->NavMoveResultOther).DistCenter,
             pIVar38->DistCenter < *pfVar30 || pIVar38->DistCenter == *pfVar30)) goto LAB_0011ad3c;
        }
        goto LAB_0011ad39;
      }
LAB_0011ad3c:
      if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar39->NavMoveRequestFlags & 0x40U) == 0) {
          IVar48 = pIVar38->Window->Pos;
          IVar60 = (pIVar38->RectRel).Min;
          fVar47 = IVar48.x;
          local_48.Min.x = IVar60.x + fVar47;
          fVar55 = IVar48.y;
          local_48.Min.y = IVar60.y + fVar55;
          IVar48 = (pIVar38->RectRel).Max;
          local_48.Max.x = IVar48.x + fVar47;
          local_48.Max.y = IVar48.y + fVar55;
          IVar48 = ScrollToBringRectIntoView(pIVar38->Window,&local_48);
        }
        else {
          pIVar22 = pIVar38->Window;
          fVar47 = 0.0;
          if (pIVar39->NavMoveDir == 2) {
            fVar47 = (pIVar22->ScrollMax).y;
          }
          IVar48 = (ImVec2)((ulong)(uint)((pIVar22->Scroll).y - fVar47) << 0x20);
          (pIVar22->ScrollTarget).y = fVar47;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
          (pIVar22->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar47 = (pIVar38->RectRel).Min.y;
        fVar55 = (pIVar38->RectRel).Max.x;
        fVar56 = (pIVar38->RectRel).Max.y;
        (pIVar38->RectRel).Min.x = (pIVar38->RectRel).Min.x - IVar48.x;
        (pIVar38->RectRel).Min.y = fVar47 - IVar48.y;
        (pIVar38->RectRel).Max.x = fVar55 - IVar48.x;
        (pIVar38->RectRel).Max.y = fVar56 - IVar48.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar39->NavWindow = pIVar38->Window;
      IVar26 = pIVar38->ID;
      if (pIVar39->NavId == IVar26) {
        IVar19 = pIVar38->FocusScopeId;
      }
      else {
        pIVar39->NavJustMovedToId = IVar26;
        IVar19 = pIVar38->FocusScopeId;
        pIVar39->NavJustMovedToFocusScopeId = IVar19;
        pIVar39->NavJustMovedToKeyMods = pIVar39->NavMoveRequestKeyMods;
      }
      pIVar41 = GImGui;
      IVar32 = pIVar39->NavLayer;
      GImGui->NavId = IVar26;
      pIVar41->NavFocusScopeId = IVar19;
      pIVar22 = pIVar41->NavWindow;
      pIVar22->NavLastIds[(int)IVar32] = IVar26;
      IVar48 = (pIVar38->RectRel).Max;
      pIVar3 = &pIVar22->NavRectRel[(int)IVar32].Min;
      *pIVar3 = (pIVar38->RectRel).Min;
      pIVar3[1] = IVar48;
      pIVar41->NavMousePosDirty = true;
    }
    pIVar41->NavDisableHighlight = false;
    pIVar41->NavDisableMouseHover = true;
  }
LAB_0011ae58:
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar39->NavMoveResultLocal).ID == 0) && ((pIVar39->NavMoveResultOther).ID == 0)) {
      pIVar39->NavDisableHighlight = false;
    }
    pIVar39->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar39->NavMousePosDirty == true) && (pIVar39->NavIdIsAlive == true)) {
    if ((((pIVar39->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar39->IO).BackendFlags & 4) != 0 && (pIVar39->NavDisableHighlight == false)) &&
         (pIVar39->NavDisableMouseHover == true)) && (pIVar39->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar48 = NavCalcPreferredRefPos();
      (pIVar39->IO).MousePosPrev = IVar48;
      (pIVar39->IO).MousePos = IVar48;
      (pIVar39->IO).WantSetMousePos = true;
    }
    pIVar39->NavMousePosDirty = false;
  }
  pIVar39->NavIdIsAlive = false;
  pIVar39->NavJustTabbedId = 0;
  pIVar22 = pIVar39->NavWindow;
  pIVar28 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar28->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar28 != pIVar22) {
          pIVar28->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
      ppIVar9 = &pIVar28->ParentWindow;
      pIVar28 = *ppIVar9;
    } while (*ppIVar9 != (ImGuiWindow *)0x0);
    if ((pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar39->NavLayer == ImGuiNavLayer_Main)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar22 = GetTopMostPopupModal();
  if (pIVar22 != (ImGuiWindow *)0x0) {
    pIVar41->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  pIVar28 = pIVar41->NavWindowingTarget;
  if (pIVar28 == (ImGuiWindow *)0x0 && pIVar41->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
    fVar47 = (pIVar41->IO).DeltaTime * -10.0 + pIVar41->NavWindowingHighlightAlpha;
    fVar47 = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
    pIVar41->NavWindowingHighlightAlpha = fVar47;
    pIVar28 = (ImGuiWindow *)0x0;
    if ((pIVar41->DimBgRatio <= 0.0) && (fVar47 <= 0.0)) {
      pIVar41->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      pIVar28 = (ImGuiWindow *)0x0;
    }
  }
  if (pIVar22 == (ImGuiWindow *)0x0) {
    if (pIVar28 != (ImGuiWindow *)0x0) {
      fVar47 = (pIVar41->IO).DeltaTime + pIVar41->NavWindowingTimer;
      pIVar41->NavWindowingTimer = fVar47;
      goto LAB_0011b026;
    }
    fVar47 = (pIVar41->IO).NavInputsDownDuration[3];
    if ((((pIVar41->IO).KeyCtrl == true) && (iVar20 = (pIVar41->IO).KeyMap[0], -1 < iVar20)) &&
       (bVar42 = IsKeyPressed(iVar20,true), bVar42)) {
      bVar45 = (byte)(pIVar41->IO).ConfigFlags;
      uVar46 = (uint)bVar45;
      if (fVar47 == 0.0 || (bVar45 & 1) != 0) {
LAB_0011b26b:
        pIVar22 = pIVar41->NavWindow;
        if ((pIVar22 != (ImGuiWindow *)0x0) ||
           (pIVar22 = FindWindowNavFocusable((pIVar41->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar22 != (ImGuiWindow *)0x0)) {
          pIVar28 = pIVar22->RootWindow;
          pIVar41->NavWindowingTargetAnim = pIVar28;
          pIVar41->NavWindowingTarget = pIVar28;
          pIVar41->NavWindowingHighlightAlpha = 0.0;
          pIVar41->NavWindowingToggleLayer = (bool)(~(byte)uVar46 & 1);
          pIVar41->NavInputSource = ImGuiInputSource_NavGamepad - (uVar46 & 1);
          fVar47 = 0.0;
          goto LAB_0011afec;
        }
      }
    }
    else if ((fVar47 == 0.0) && (!NAN(fVar47))) {
      uVar46 = 0;
      goto LAB_0011b26b;
    }
    pIVar41->NavWindowingTimer = (pIVar41->IO).DeltaTime + pIVar41->NavWindowingTimer;
LAB_0011b323:
    bVar42 = false;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    fVar47 = pIVar41->NavWindowingTimer;
LAB_0011afec:
    fVar47 = fVar47 + (pIVar41->IO).DeltaTime;
    pIVar41->NavWindowingTimer = fVar47;
    if (pIVar28 == (ImGuiWindow *)0x0) goto LAB_0011b323;
LAB_0011b026:
    IVar27 = pIVar41->NavInputSource;
    pIVar23 = pIVar41;
    if (IVar27 != ImGuiInputSource_NavGamepad) {
LAB_0011b186:
      if (IVar27 == ImGuiInputSource_NavKeyboard) {
        fVar55 = (pIVar41->NavWindowingTimer + -0.2) / 0.05;
        fVar47 = 1.0;
        if (fVar55 <= 1.0) {
          fVar47 = fVar55;
        }
        fVar47 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar47);
        uVar46 = -(uint)(fVar47 <= pIVar41->NavWindowingHighlightAlpha);
        pIVar41->NavWindowingHighlightAlpha =
             (float)(uVar46 & (uint)pIVar41->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
        iVar20 = (pIVar23->IO).KeyMap[0];
        if ((-1 < iVar20) && (bVar42 = IsKeyPressed(iVar20,true), bVar42)) {
          NavUpdateWindowingHighlightWindow((pIVar41->IO).KeyShift - 1 | 1);
        }
        if ((pIVar41->IO).KeyCtrl == false) {
          pIVar22 = pIVar41->NavWindowingTarget;
          bVar42 = false;
          goto LAB_0011b328;
        }
      }
      goto LAB_0011b323;
    }
    fVar55 = (fVar47 + -0.2) / 0.05;
    fVar47 = 1.0;
    if (fVar55 <= 1.0) {
      fVar47 = fVar55;
    }
    fVar47 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar47);
    uVar46 = -(uint)(fVar47 <= pIVar41->NavWindowingHighlightAlpha);
    fVar56 = (float)(uVar46 & (uint)pIVar41->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
    pIVar41->NavWindowingHighlightAlpha = fVar56;
    fVar47 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar55 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar20 = (uint)(0.0 < fVar47) - (uint)(0.0 < fVar55);
    if (iVar20 != 0) {
      NavUpdateWindowingHighlightWindow(iVar20);
      pIVar41->NavWindowingHighlightAlpha = 1.0;
      fVar56 = 1.0;
      pIVar23 = GImGui;
    }
    if (0.0 < (pIVar23->IO).NavInputs[3]) {
      if (pIVar41->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0011b323;
      IVar27 = pIVar41->NavInputSource;
      goto LAB_0011b186;
    }
    pbVar35 = &pIVar41->NavWindowingToggleLayer;
    *pbVar35 = (bool)(*pbVar35 & fVar56 < 1.0);
    if (*pbVar35 == false) {
      pIVar22 = pIVar41->NavWindowingTarget;
      bVar42 = false;
    }
    else {
      bVar42 = pIVar41->NavWindow != (ImGuiWindow *)0x0;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    pIVar41->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0011b328:
  pIVar23 = GImGui;
  fVar47 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    pIVar41->NavWindowingToggleLayer = true;
  }
  if ((((pIVar41->ActiveId == 0) || (pIVar41->ActiveIdAllowOverlap == true)) && (fVar47 < 0.0)) &&
     ((pIVar41->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar23->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar42 = (bool)(((pIVar41->IO).MousePosPrev.y < -256000.0 ||
                    (pIVar41->IO).MousePosPrev.x < -256000.0) !=
                    (-256000.0 <= (pIVar41->IO).MousePos.y && -256000.0 <= (pIVar41->IO).MousePos.x)
                   | bVar42);
  }
  pIVar28 = pIVar41->NavWindowingTarget;
  if ((pIVar28 != (ImGuiWindow *)0x0) && ((pIVar28->Flags & 4) == 0)) {
    IVar27 = pIVar41->NavInputSource;
    if ((IVar27 == ImGuiInputSource_NavGamepad) ||
       ((IVar48.x = 0.0, IVar48.y = 0.0, IVar27 == ImGuiInputSource_NavKeyboard &&
        (IVar27 = ImGuiInputSource_Mouse, (pIVar41->IO).KeyShift == false)))) {
      IVar48 = GetNavInputAmount2d(IVar27,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar47 = IVar48.y;
    if (((IVar48.x != 0.0) || (fVar47 != 0.0)) || (NAN(fVar47))) {
      fVar55 = (pIVar41->IO).DisplayFramebufferScale.x;
      fVar56 = (pIVar41->IO).DisplayFramebufferScale.y;
      if (fVar56 <= fVar55) {
        fVar55 = fVar56;
      }
      fVar55 = (float)(int)(fVar55 * (pIVar41->IO).DeltaTime * 800.0);
      pIVar28 = pIVar28->RootWindow;
      local_48.Min.x = (pIVar28->Pos).x + IVar48.x * fVar55;
      local_48.Min.y = (pIVar28->Pos).y + fVar47 * fVar55;
      SetWindowPos(pIVar28,&local_48.Min,1);
      if (((pIVar28->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar41->NavDisableMouseHover = true;
    }
  }
  if (pIVar22 != (ImGuiWindow *)0x0) {
    if ((pIVar41->NavWindow == (ImGuiWindow *)0x0) || (pIVar22 != pIVar41->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar41->NavDisableHighlight = false;
      pIVar41->NavDisableMouseHover = true;
      pIVar28 = pIVar22->NavLastChildNavWindow;
      if ((pIVar28 == (ImGuiWindow *)0x0) || (pIVar28->WasActive == false)) {
        pIVar28 = pIVar22;
      }
      ClosePopupsOverWindow(pIVar28,false);
      FocusWindow(pIVar28);
      if (pIVar28->NavLastIds[0] == 0) {
        NavInitWindow(pIVar28,false);
      }
      if ((pIVar28->DC).NavLayerActiveMask == 2) {
        pIVar41->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar41->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar42) && (pIVar22 = pIVar41->NavWindow, pIVar28 = pIVar22, pIVar22 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar28, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar28 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar22) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar22;
      pIVar22 = pIVar41->NavWindow;
    }
    pIVar41->NavDisableHighlight = false;
    pIVar41->NavDisableMouseHover = true;
    IVar32 = ImGuiNavLayer_Main;
    if (((pIVar22->DC).NavLayerActiveMask & 2) != 0) {
      IVar32 = pIVar41->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar32);
  }
  if (((bool)((uVar17 & 1) == 0 & (bVar13 ^ 1))) || (pIVar39->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar39->IO).NavActive = false;
LAB_0011b62b:
    bVar42 = pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar42 = (pIVar39->NavWindow->Flags & 0x40000U) == 0;
    (pIVar39->IO).NavActive = bVar42;
    if (((!bVar42) || (pIVar39->NavId == 0)) ||
       (bVar42 = true, pIVar39->NavDisableHighlight != false)) goto LAB_0011b62b;
  }
  (pIVar39->IO).NavVisible = bVar42;
  fVar47 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    if (pIVar39->ActiveId == 0) {
      pIVar22 = pIVar39->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar20 = (pIVar39->OpenPopupStack).Size;
        if ((long)iVar20 < 1) {
          if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar39->NavId = 0;
            pIVar39->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar39->OpenPopupStack).Data[(long)iVar20 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar20 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar22->ParentWindow);
        pIVar41 = GImGui;
        IVar26 = pIVar22->ChildId;
        GImGui->NavId = IVar26;
        pIVar41->NavFocusScopeId = 0;
        pIVar41->NavWindow->NavLastIds[0] = IVar26;
        pIVar39->NavIdIsAlive = false;
        if (pIVar39->NavDisableMouseHover == true) {
          pIVar39->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar39->NavActivateId = 0;
  pIVar39->NavActivateDownId = 0;
  pIVar39->NavActivatePressedId = 0;
  pIVar41 = GImGui;
  pIVar39->NavInputId = 0;
  IVar26 = pIVar39->NavId;
  if (((IVar26 == 0) || (pIVar39->NavDisableHighlight != false)) ||
     (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0011b796:
    pIVar22 = pIVar39->NavWindow;
    if (pIVar22 == (ImGuiWindow *)0x0) goto LAB_0011b7ff;
    if ((pIVar22->Flags & 0x40000) != 0) {
      pIVar39->NavDisableHighlight = true;
    }
    bVar42 = false;
  }
  else {
    if (pIVar39->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar39->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar47 = (GImGui->IO).NavInputsDownDuration[0];
          if (0.0 <= fVar47) {
            IVar19 = pIVar39->ActiveId;
            if (IVar19 == 0 && fVar47 == 0.0) {
              pIVar39->NavActivateId = IVar26;
              pIVar39->NavActivateDownId = IVar26;
            }
            else {
              if ((IVar19 != 0) && (IVar19 != IVar26)) goto LAB_0011b7f6;
              pIVar39->NavActivateDownId = IVar26;
              if ((fVar47 != 0.0) || (NAN(fVar47))) goto LAB_0011ce81;
            }
            pIVar39->NavActivatePressedId = IVar26;
          }
          else {
            IVar19 = pIVar39->ActiveId;
            if ((IVar19 != 0) && (IVar19 != IVar26)) goto LAB_0011b7f6;
            pIVar39->NavActivateDownId = IVar26;
          }
        }
        else {
          IVar19 = pIVar39->ActiveId;
          if (IVar19 != 0) {
LAB_0011b7f6:
            if (IVar19 != IVar26) goto LAB_0011b796;
          }
        }
LAB_0011ce81:
        fVar47 = (pIVar41->IO).NavInputsDownDuration[2];
        if ((fVar47 == 0.0) && (!NAN(fVar47))) {
          pIVar39->NavInputId = IVar26;
        }
      }
      goto LAB_0011b796;
    }
LAB_0011b7ff:
    bVar42 = true;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  pIVar39->NavMoveRequest = false;
  IVar19 = pIVar39->NavNextActivateId;
  if (IVar19 != 0) {
    pIVar39->NavActivateId = IVar19;
    pIVar39->NavActivateDownId = IVar19;
    pIVar39->NavActivatePressedId = IVar19;
    pIVar39->NavInputId = IVar19;
  }
  pIVar39->NavNextActivateId = 0;
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar39->NavMoveDir = -1;
    pIVar39->NavMoveRequestFlags = 0;
    IVar29 = -1;
    if (((!bVar42) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      uVar46 = GImGui->ActiveIdUsingNavDirMask;
      IVar29 = -1;
      if (((uVar46 & 1) == 0) &&
         ((fVar47 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar39->NavMoveDir = 0;
        IVar29 = 0;
      }
      if (((uVar46 & 2) == 0) &&
         ((fVar47 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar39->NavMoveDir = 1;
        IVar29 = 1;
      }
      if (((uVar46 & 4) == 0) &&
         ((fVar47 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar39->NavMoveDir = 2;
        IVar29 = 2;
      }
      if (((uVar46 & 8) == 0) &&
         ((fVar47 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar39->NavMoveDir = 3;
        IVar29 = 3;
      }
    }
    pIVar39->NavMoveClipDir = IVar29;
  }
  else {
    pIVar39->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar41 = GImGui;
  fVar47 = 0.0;
  if ((((((uVar17 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar28 = GImGui->NavWindow, pIVar28 != (ImGuiWindow *)0x0)) &&
      (((pIVar28->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    iVar20 = (GImGui->IO).KeyMap[5];
    bVar44 = false;
    bVar43 = false;
    if ((-1 < (long)iVar20) && ((GImGui->IO).KeysDown[iVar20] == true)) {
      bVar43 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    iVar18 = (GImGui->IO).KeyMap[6];
    if ((-1 < (long)iVar18) && ((GImGui->IO).KeysDown[iVar18] == true)) {
      bVar44 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar15 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar15) {
      bVar15 = (pIVar41->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar15 = false;
    }
    bVar16 = IsKeyPressed((pIVar41->IO).KeyMap[8],true);
    if (bVar16) {
      bVar16 = (pIVar41->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar16 = false;
    }
    fVar47 = 0.0;
    if ((bVar43 != bVar44) || (bVar15 != bVar16)) {
      if (((pIVar28->DC).NavLayerActiveMask == 0) && ((pIVar28->DC).NavHasScroll == true)) {
        bVar44 = IsKeyPressed(iVar20,true);
        if (bVar44) {
          fVar47 = (pIVar28->Scroll).y - ((pIVar28->InnerRect).Max.y - (pIVar28->InnerRect).Min.y);
LAB_0011d124:
          (pIVar28->ScrollTarget).y = fVar47;
        }
        else {
          bVar44 = IsKeyPressed(iVar18,true);
          if (bVar44) {
            fVar47 = ((pIVar28->InnerRect).Max.y - (pIVar28->InnerRect).Min.y) + (pIVar28->Scroll).y
            ;
            goto LAB_0011d124;
          }
          if (bVar15 == false) {
            if (bVar16 == false) goto LAB_0011d136;
            fVar47 = (pIVar28->ScrollMax).y;
            goto LAB_0011d124;
          }
          (pIVar28->ScrollTarget).y = 0.0;
        }
        (pIVar28->ScrollTargetCenterRatio).y = 0.0;
        (pIVar28->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0011d136:
        fVar47 = 0.0;
      }
      else {
        fVar47 = pIVar41->FontBaseSize * pIVar28->FontWindowScale;
        if (pIVar28->ParentWindow != (ImGuiWindow *)0x0) {
          fVar47 = fVar47 * pIVar28->ParentWindow->FontWindowScale;
        }
        fVar47 = (pIVar28->NavRectRel[0].Max.y - pIVar28->NavRectRel[0].Min.y) +
                 (((pIVar28->InnerRect).Max.y - (pIVar28->InnerRect).Min.y) - fVar47);
        fVar47 = (float)(~-(uint)(fVar47 <= 0.0) & (uint)fVar47);
        bVar44 = IsKeyPressed(iVar20,true);
        if (bVar44) {
          fVar47 = -fVar47;
          pIVar41->NavMoveDir = 3;
          pIVar41->NavMoveClipDir = 2;
          pIVar41->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar44 = IsKeyPressed(iVar18,true);
          if (!bVar44) {
            if (bVar15 == false) {
              fVar47 = 0.0;
              if (bVar16 != false) {
                fVar55 = ((pIVar28->ScrollMax).y + (pIVar28->SizeFull).y) - (pIVar28->Scroll).y;
                pIVar28->NavRectRel[0].Max.y = fVar55;
                pIVar28->NavRectRel[0].Min.y = fVar55;
                fVar55 = pIVar28->NavRectRel[0].Min.x;
                pIVar3 = &pIVar28->NavRectRel[0].Max;
                if (pIVar3->x <= fVar55 && fVar55 != pIVar3->x) {
                  pIVar28->NavRectRel[0].Max.x = 0.0;
                  pIVar28->NavRectRel[0].Min.x = 0.0;
                }
                pIVar41->NavMoveDir = 2;
                pIVar41->NavMoveRequestFlags = 0x50;
              }
              goto LAB_0011ba23;
            }
            fVar47 = -(pIVar28->Scroll).y;
            pIVar28->NavRectRel[0].Max.y = fVar47;
            pIVar28->NavRectRel[0].Min.y = fVar47;
            fVar47 = pIVar28->NavRectRel[0].Min.x;
            pIVar3 = &pIVar28->NavRectRel[0].Max;
            if (pIVar3->x <= fVar47 && fVar47 != pIVar3->x) {
              pIVar28->NavRectRel[0].Max.x = 0.0;
              pIVar28->NavRectRel[0].Min.x = 0.0;
            }
            pIVar41->NavMoveDir = 3;
            pIVar41->NavMoveRequestFlags = 0x50;
            goto LAB_0011d136;
          }
          pIVar41->NavMoveDir = 2;
          pIVar41->NavMoveClipDir = 3;
          pIVar41->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_0011ba23:
  uVar17 = pIVar39->NavMoveDir;
  if (uVar17 == 0xffffffff) {
    bVar45 = 0;
  }
  else {
    pIVar39->NavMoveRequest = true;
    pIVar39->NavMoveRequestKeyMods = (pIVar39->IO).KeyMods;
    pIVar39->NavMoveDirLast = uVar17;
    bVar45 = 1;
    if (IVar26 == 0) {
      pIVar39->NavInitRequest = true;
      pIVar39->NavInitRequestFromMove = true;
      pIVar39->NavInitResultId = 0;
      pIVar39->NavDisableHighlight = false;
    }
  }
  pIVar41 = GImGui;
  bVar44 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar44 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar44;
  if (((!bVar42) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = pIVar41->FontBaseSize * pIVar22->FontWindowScale;
    if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
      fVar55 = fVar55 * pIVar22->ParentWindow->FontWindowScale;
    }
    fVar55 = (float)(int)(fVar55 * 100.0 * (pIVar39->IO).DeltaTime + 0.5);
    if (((pIVar22->DC).NavLayerActiveMask == 0) && ((bVar45 & (pIVar22->DC).NavHasScroll) == 1)) {
      if (uVar17 < 2) {
        lVar37 = 0x7c;
        lVar36 = 0x74;
        lVar31 = 0x6c;
        lVar34 = 0x5c;
        uVar46 = 0;
      }
      else {
        if ((uVar17 & 0xfffffffe) != 2) goto LAB_0011bcab;
        lVar37 = 0x80;
        lVar36 = 0x78;
        lVar31 = 0x70;
        uVar46 = 2;
        lVar34 = 0x60;
      }
      *(float *)((long)&pIVar22->Name + lVar31) =
           (float)(int)(*(float *)(&DAT_001669a4 + (ulong)(uVar17 == uVar46) * 4) * fVar55 +
                       *(float *)((long)&pIVar22->Name + lVar34));
      *(undefined4 *)((long)&pIVar22->Name + lVar36) = 0;
      *(undefined4 *)((long)&pIVar22->Name + lVar37) = 0;
    }
LAB_0011bcab:
    IVar48 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar56 = IVar48.x;
    fVar59 = IVar48.y;
    if (((fVar56 != 0.0) || (NAN(fVar56))) && (pIVar22->ScrollbarX == true)) {
      (pIVar22->ScrollTarget).x = (float)(int)(fVar56 * fVar55 + (pIVar22->Scroll).x);
      (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      (pIVar22->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar59 != 0.0) || (NAN(fVar59))) {
      (pIVar22->ScrollTarget).y = (float)(int)(fVar59 * fVar55 + (pIVar22->Scroll).y);
      (pIVar22->ScrollTargetCenterRatio).y = 0.0;
      (pIVar22->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar39->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocal).ID = 0;
  (pIVar39->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultOther).ID = 0;
  (pIVar39->NavMoveResultOther).FocusScopeId = 0;
  (pIVar39->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((uVar17 != 0xffffffff) && (pIVar39->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar39->NavLayer == ImGuiNavLayer_Main)) {
    fVar55 = (pIVar22->Pos).x;
    fVar56 = (pIVar22->Pos).y;
    auVar62._0_4_ = ((pIVar22->InnerRect).Min.x - fVar55) + -1.0;
    auVar62._4_4_ = ((pIVar22->InnerRect).Min.y - fVar56) + -1.0;
    auVar62._8_4_ = ((pIVar22->InnerRect).Max.x - fVar55) + 1.0;
    auVar62._12_4_ = ((pIVar22->InnerRect).Max.y - fVar56) + 1.0;
    if (((pIVar22->NavRectRel[0].Min.x < auVar62._0_4_) ||
        (pIVar22->NavRectRel[0].Min.y < auVar62._4_4_)) ||
       ((auVar62._8_4_ < pIVar22->NavRectRel[0].Max.x ||
        (auVar62._12_4_ < pIVar22->NavRectRel[0].Max.y)))) {
      fVar55 = pIVar41->FontBaseSize * pIVar22->FontWindowScale;
      if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
        fVar55 = fVar55 * pIVar22->ParentWindow->FontWindowScale;
      }
      auVar57._0_4_ = fVar55 * 0.5;
      auVar53._0_4_ = auVar62._8_4_ - auVar62._0_4_;
      auVar53._4_4_ = auVar62._12_4_ - auVar62._4_4_;
      auVar53._8_4_ = auVar62._8_4_ - auVar62._8_4_;
      auVar53._12_4_ = auVar62._12_4_ - auVar62._12_4_;
      auVar57._4_4_ = auVar57._0_4_;
      auVar57._8_4_ = auVar57._0_4_;
      auVar57._12_4_ = auVar57._0_4_;
      auVar53 = minps(auVar53,auVar57);
      local_48.Min.x = auVar53._0_4_ + auVar62._0_4_;
      local_48.Min.y = auVar53._4_4_ + auVar62._4_4_;
      auVar12._4_8_ = auVar62._8_8_;
      auVar12._0_4_ = auVar62._4_4_ - auVar57._0_4_;
      auVar51._0_8_ = auVar12._0_8_ << 0x20;
      auVar51._8_4_ = auVar62._8_4_ - auVar53._0_4_;
      auVar51._12_4_ = auVar62._12_4_ - auVar53._4_4_;
      local_48.Max = auVar51._8_8_;
      ImRect::ClipWithFull(pIVar22->NavRectRel,&local_48);
      pIVar39->NavId = 0;
      pIVar39->NavFocusScopeId = 0;
      pIVar22 = pIVar39->NavWindow;
    }
  }
  if (pIVar22 == (ImGuiWindow *)0x0) {
    auVar50 = ZEXT812(0x3f800000);
    fVar56 = 0.0;
    fVar55 = 0.0;
    fVar59 = 0.0;
  }
  else {
    IVar32 = pIVar39->NavLayer;
    fVar54 = (pIVar22->Pos).x;
    fVar55 = (pIVar22->Pos).y;
    fVar56 = pIVar22->NavRectRel[IVar32].Min.y + fVar55;
    fVar59 = fVar54 + pIVar22->NavRectRel[IVar32].Max.x;
    fVar55 = fVar55 + pIVar22->NavRectRel[IVar32].Max.y;
    auVar50._4_8_ = 0;
    auVar50._0_4_ = pIVar22->NavRectRel[IVar32].Min.x + fVar54 + 1.0;
  }
  if (fVar59 <= auVar50._0_4_) {
    auVar50._4_8_ = auVar50._4_8_;
    auVar50._0_4_ = fVar59;
  }
  (pIVar39->NavScoringRect).Min.y = fVar56 + fVar47;
  (pIVar39->NavScoringRect).Max.y = fVar55 + fVar47;
  (pIVar39->NavScoringRect).Min.x = auVar50._0_4_;
  (pIVar39->NavScoringRect).Max.x = auVar50._0_4_;
  pIVar39->NavScoringCount = 0;
  pIVar39 = GImGui;
  fVar47 = (GImGui->IO).MousePos.x;
  fVar55 = (GImGui->IO).MousePos.y;
  if ((-256000.0 <= fVar47) && (-256000.0 <= fVar55)) {
    fVar47 = (float)(int)fVar47;
    fVar55 = (float)(int)fVar55;
    (GImGui->LastValidMousePos).x = fVar47;
    (pIVar39->LastValidMousePos).y = fVar55;
    (pIVar39->IO).MousePos.x = fVar47;
    (pIVar39->IO).MousePos.y = fVar55;
  }
  if ((fVar47 < -256000.0) || (fVar55 < -256000.0)) {
LAB_0011c001:
    (pIVar39->IO).MouseDelta.x = 0.0;
    (pIVar39->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar48 = (pIVar39->IO).MousePosPrev;
    fVar56 = IVar48.x;
    if ((fVar56 < -256000.0) || (fVar59 = IVar48.y, fVar59 < -256000.0)) goto LAB_0011c001;
    IVar60.x = fVar47 - fVar56;
    IVar60.y = fVar55 - fVar59;
    (pIVar39->IO).MouseDelta = IVar60;
    if ((((IVar60.x != 0.0) || (NAN(IVar60.x))) || (IVar60.y != 0.0)) || (NAN(IVar60.y))) {
      pIVar39->NavDisableMouseHover = false;
    }
  }
  IVar48 = (pIVar39->IO).MousePos;
  (pIVar39->IO).MousePosPrev = IVar48;
  fVar47 = IVar48.x;
  lVar37 = 0;
  do {
    bVar45 = (pIVar39->IO).MouseDown[lVar37];
    if ((bool)bVar45 == true) {
      fVar56 = (pIVar39->IO).MouseDownDuration[lVar37];
      pbVar35 = (pIVar39->IO).MouseClicked + lVar37;
      *pbVar35 = fVar56 < 0.0;
      pbVar35[10] = false;
      (pIVar39->IO).MouseDownDurationPrev[lVar37] = fVar56;
      if (0.0 <= fVar56) {
        (pIVar39->IO).MouseDownDuration[lVar37] = fVar56 + (pIVar39->IO).DeltaTime;
        (pIVar39->IO).MouseDoubleClicked[lVar37] = false;
        auVar63 = ZEXT816(0);
        if (-256000.0 <= fVar47 && -256000.0 <= fVar55) {
          IVar60 = (pIVar39->IO).MouseClickedPos[lVar37];
          auVar63._0_4_ = fVar47 - IVar60.x;
          auVar63._4_4_ = fVar55 - IVar60.y;
          auVar63._8_8_ = 0;
        }
        fVar56 = (pIVar39->IO).MouseDragMaxDistanceSqr[lVar37];
        fVar59 = auVar63._0_4_ * auVar63._0_4_ + auVar63._4_4_ * auVar63._4_4_;
        uVar17 = -(uint)(fVar59 <= fVar56);
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar37] =
             (float)(~uVar17 & (uint)fVar59 | (uint)fVar56 & uVar17);
        IVar60 = (pIVar39->IO).MouseDragMaxDistanceAbs[lVar37];
        fVar56 = IVar60.x;
        fVar59 = IVar60.y;
        auVar64._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
        auVar64._8_4_ = auVar63._8_4_ ^ 0x80000000;
        auVar64._12_4_ = auVar63._12_4_ ^ 0x80000000;
        auVar62 = maxps(auVar64,auVar63);
        uVar17 = -(uint)(auVar62._0_4_ <= fVar56);
        uVar46 = -(uint)(auVar62._4_4_ <= fVar59);
        (pIVar39->IO).MouseDragMaxDistanceAbs[lVar37] =
             (ImVec2)(CONCAT44(~uVar46 & (uint)auVar62._4_4_,~uVar17 & (uint)auVar62._0_4_) |
                     CONCAT44((uint)fVar59 & uVar46,(uint)fVar56 & uVar17));
      }
      else {
        (pIVar39->IO).MouseDownDuration[lVar37] = 0.0;
        (pIVar39->IO).MouseDoubleClicked[lVar37] = false;
        dVar4 = pIVar39->Time;
        fVar56 = (pIVar39->IO).MouseDoubleClickTime;
        if ((float)(dVar4 - (pIVar39->IO).MouseClickedTime[lVar37]) < fVar56) {
          fVar59 = 0.0;
          fVar54 = 0.0;
          if (-256000.0 <= fVar47 && -256000.0 <= fVar55) {
            IVar60 = (pIVar39->IO).MouseClickedPos[lVar37];
            fVar59 = fVar47 - IVar60.x;
            fVar54 = fVar55 - IVar60.y;
          }
          fVar52 = (pIVar39->IO).MouseDoubleClickMaxDist;
          if (fVar59 * fVar59 + fVar54 * fVar54 < fVar52 * fVar52) {
            (pIVar39->IO).MouseDoubleClicked[lVar37] = true;
          }
          dVar4 = (double)(fVar56 * -2.0);
        }
        (pIVar39->IO).MouseClickedTime[lVar37] = dVar4;
        (pIVar39->IO).MouseClickedPos[lVar37] = IVar48;
        (pIVar39->IO).MouseDownWasDoubleClick[lVar37] = (pIVar39->IO).MouseDoubleClicked[lVar37];
        pIVar3 = (pIVar39->IO).MouseDragMaxDistanceAbs + lVar37;
        pIVar3->x = 0.0;
        pIVar3->y = 0.0;
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar37] = 0.0;
        bVar45 = (pIVar39->IO).MouseDown[lVar37];
      }
    }
    else {
      (pIVar39->IO).MouseClicked[lVar37] = false;
      fVar56 = (pIVar39->IO).MouseDownDuration[lVar37];
      (pIVar39->IO).MouseReleased[lVar37] = 0.0 <= fVar56;
      pbVar35 = (pIVar39->IO).MouseClicked + lVar37;
      (pIVar39->IO).MouseDownDurationPrev[lVar37] = fVar56;
      (pIVar39->IO).MouseDownDuration[lVar37] = -1.0;
      (pIVar39->IO).MouseDoubleClicked[lVar37] = false;
    }
    if (((bVar45 & 1) == 0) && ((pIVar39->IO).MouseReleased[lVar37] == false)) {
      (pIVar39->IO).MouseDownWasDoubleClick[lVar37] = false;
    }
    if (*pbVar35 == true) {
      pIVar39->NavDisableMouseHover = false;
    }
    lVar37 = lVar37 + 1;
  } while (lVar37 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar22 = GetTopMostPopupModal();
  if ((pIVar22 != (ImGuiWindow *)0x0) ||
     ((pIVar14->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar14->NavWindowingHighlightAlpha)))) {
    fVar47 = (pIVar14->IO).DeltaTime * 6.0 + pIVar14->DimBgRatio;
    if (1.0 <= fVar47) {
      fVar47 = 1.0;
    }
    pIVar14->DimBgRatio = fVar47;
  }
  else {
    fVar47 = (pIVar14->IO).DeltaTime * -10.0 + pIVar14->DimBgRatio;
    pIVar14->DimBgRatio = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
  }
  pIVar14->MouseCursor = 0;
  pIVar14->WantTextInputNextFrame = -1;
  pIVar14->WantCaptureMouseNextFrame = -1;
  pIVar14->WantCaptureKeyboardNextFrame = -1;
  (pIVar14->PlatformImePos).x = 1.0;
  pIVar39 = GImGui;
  (pIVar14->PlatformImePos).y = 1.0;
  pIVar22 = GImGui->WheelingWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
LAB_0011c3c4:
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    fVar55 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar55;
    fVar47 = (pIVar39->IO).MousePos.x;
    if ((((-256000.0 <= fVar47) && (fVar56 = (pIVar39->IO).MousePos.y, -256000.0 <= fVar56)) &&
        (fVar47 = fVar47 - (pIVar39->WheelingWindowRefMousePos).x,
        fVar56 = fVar56 - (pIVar39->WheelingWindowRefMousePos).y,
        fVar59 = (pIVar39->IO).MouseDragThreshold,
        fVar59 * fVar59 < fVar47 * fVar47 + fVar56 * fVar56)) || (fVar55 <= 0.0)) {
      pIVar39->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar39->WheelingWindowTimer = 0.0;
      goto LAB_0011c3c4;
    }
  }
  fVar47 = (pIVar39->IO).MouseWheel;
  if (((((fVar47 != 0.0) || (fVar55 = (pIVar39->IO).MouseWheelH, fVar55 != 0.0)) || (NAN(fVar55)))
      && ((pIVar39->ActiveId == 0 || (pIVar39->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar39->HoveredIdPreviousFrame == 0 ||
       (pIVar39->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar28 = pIVar22, pIVar22 != (ImGuiWindow *)0x0 ||
        (pIVar28 = pIVar39->HoveredWindow, pIVar28 != (ImGuiWindow *)0x0)) &&
       (pIVar28->Collapsed == false)))))) {
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      if ((pIVar39->IO).KeyCtrl == true) {
        if ((pIVar39->IO).FontAllowUserScaling == true) {
          if (pIVar22 != pIVar28) {
            pIVar39->WheelingWindow = pIVar28;
            pIVar39->WheelingWindowRefMousePos = (pIVar39->IO).MousePos;
            pIVar39->WheelingWindowTimer = 2.0;
          }
          fVar55 = pIVar28->FontWindowScale;
          fVar56 = fVar47 * 0.1 + fVar55;
          fVar47 = 2.5;
          if (fVar56 <= 2.5) {
            fVar47 = fVar56;
          }
          fVar47 = (float)(-(uint)(fVar56 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar56 < 0.5) & (uint)fVar47);
          pIVar28->FontWindowScale = fVar47;
          if ((pIVar28->Flags & 0x1000000) == 0) {
            fVar47 = fVar47 / fVar55;
            IVar48 = pIVar28->Size;
            auVar58._8_8_ = 0;
            auVar58._0_4_ = IVar48.x;
            auVar58._4_4_ = IVar48.y;
            IVar60 = (pIVar39->IO).MousePos;
            fVar55 = (pIVar28->Pos).x;
            fVar56 = (pIVar28->Pos).y;
            auVar61._0_4_ = (IVar60.x - fVar55) * (1.0 - fVar47) * IVar48.x;
            auVar61._4_4_ = (IVar60.y - fVar56) * (1.0 - fVar47) * IVar48.y;
            auVar61._8_8_ = 0;
            auVar62 = divps(auVar61,auVar58);
            local_48.Min.x = auVar62._0_4_ + fVar55;
            local_48.Min.y = auVar62._4_4_ + fVar56;
            SetWindowPos(pIVar28,&local_48.Min,0);
            IVar48 = pIVar28->SizeFull;
            IVar49.x = (float)(int)((pIVar28->Size).x * fVar47);
            IVar49.y = (float)(int)((pIVar28->Size).y * fVar47);
            pIVar28->Size = IVar49;
            (pIVar28->SizeFull).x = (float)(int)(IVar48.x * fVar47);
            (pIVar28->SizeFull).y = (float)(int)(IVar48.y * fVar47);
            pIVar39 = GImGui;
          }
          goto LAB_0011c433;
        }
      }
      else if ((pIVar39->IO).KeyShift == false) {
        if (pIVar22 != pIVar28) {
          pIVar39->WheelingWindow = pIVar28;
          pIVar39->WheelingWindowRefMousePos = (pIVar39->IO).MousePos;
          pIVar39->WheelingWindowTimer = 2.0;
          pIVar22 = pIVar28;
        }
        uVar17 = pIVar28->Flags;
        while (((uVar17 >> 0x18 & 1) != 0 &&
               (((uVar17 & 0x210) == 0x10 ||
                ((fVar55 = (pIVar28->ScrollMax).y, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
          pIVar28 = pIVar28->ParentWindow;
          uVar17 = pIVar28->Flags;
        }
        if ((uVar17 & 0x210) == 0) {
          fVar55 = ((pIVar28->InnerRect).Max.y - (pIVar28->InnerRect).Min.y) * 0.67;
          fVar56 = pIVar39->FontBaseSize * pIVar28->FontWindowScale;
          if (pIVar28->ParentWindow != (ImGuiWindow *)0x0) {
            fVar56 = fVar56 * pIVar28->ParentWindow->FontWindowScale;
          }
          fVar59 = fVar56 * 5.0;
          if (fVar55 <= fVar56 * 5.0) {
            fVar59 = fVar55;
          }
          (pIVar28->ScrollTarget).y = (pIVar28->Scroll).y - (float)(int)fVar59 * fVar47;
          (pIVar28->ScrollTargetCenterRatio).y = 0.0;
          (pIVar28->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    fVar55 = (pIVar39->IO).MouseWheelH;
    if (((((fVar55 != 0.0) || (NAN(fVar55))) && ((pIVar39->IO).KeyShift != true)) ||
        (((fVar47 != 0.0 || (NAN(fVar47))) && (fVar55 = fVar47, (pIVar39->IO).KeyShift == true))))
       && ((pIVar39->IO).KeyCtrl == false)) {
      if (pIVar22 != pIVar28) {
        pIVar39->WheelingWindow = pIVar28;
        pIVar39->WheelingWindowRefMousePos = (pIVar39->IO).MousePos;
        pIVar39->WheelingWindowTimer = 2.0;
      }
      uVar17 = pIVar28->Flags;
      while (((uVar17 >> 0x18 & 1) != 0 &&
             (((uVar17 & 0x210) == 0x10 ||
              ((fVar47 = (pIVar28->ScrollMax).x, fVar47 == 0.0 && (!NAN(fVar47)))))))) {
        pIVar28 = pIVar28->ParentWindow;
        uVar17 = pIVar28->Flags;
      }
      if ((uVar17 & 0x210) == 0) {
        fVar47 = ((pIVar28->InnerRect).Max.x - (pIVar28->InnerRect).Min.x) * 0.67;
        fVar56 = pIVar39->FontBaseSize * pIVar28->FontWindowScale;
        if (pIVar28->ParentWindow != (ImGuiWindow *)0x0) {
          fVar56 = fVar56 * pIVar28->ParentWindow->FontWindowScale;
        }
        fVar59 = fVar56 + fVar56;
        if (fVar47 <= fVar56 + fVar56) {
          fVar59 = fVar47;
        }
        (pIVar28->ScrollTarget).x = (pIVar28->Scroll).x - fVar55 * (float)(int)fVar59;
        (pIVar28->ScrollTargetCenterRatio).x = 0.0;
        (pIVar28->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0011c433:
  pIVar22 = pIVar39->NavWindow;
  if ((((pIVar22 == (ImGuiWindow *)0x0) || (pIVar22->Active != true)) ||
      ((pIVar22->Flags & 0x40000) != 0)) ||
     (((pIVar39->IO).KeyCtrl != false || (iVar20 = (pIVar39->IO).KeyMap[0], iVar20 < 0)))) {
    pIVar39->FocusTabPressed = false;
LAB_0011c4d6:
    pIVar22 = pIVar39->FocusRequestNextWindow;
    pIVar39->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
    pIVar39->FocusRequestCurrCounterRegular = 0x7fffffff;
    pIVar39->FocusRequestCurrCounterTabStop = 0x7fffffff;
    if (pIVar22 != (ImGuiWindow *)0x0) {
      pIVar39->FocusRequestCurrWindow = pIVar22;
      if ((pIVar39->FocusRequestNextCounterRegular != 0x7fffffff) &&
         (iVar20 = (pIVar22->DC).FocusCounterRegular, iVar20 != -1)) {
        pIVar39->FocusRequestCurrCounterRegular =
             (pIVar39->FocusRequestNextCounterRegular + iVar20 + 1) % (iVar20 + 1);
      }
      goto LAB_0011c52f;
    }
  }
  else {
    bVar42 = IsKeyPressed(iVar20,true);
    pIVar39->FocusTabPressed = bVar42;
    if ((!bVar42) || (pIVar39->ActiveId != 0)) goto LAB_0011c4d6;
    pIVar39->FocusRequestNextWindow = pIVar22;
    pIVar39->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar39->NavId == 0) || (pIVar39->NavIdTabCounter == 0x7fffffff)) {
      iVar20 = -(uint)(pIVar39->IO).KeyShift;
    }
    else {
      iVar20 = pIVar39->NavIdTabCounter + (-(uint)(pIVar39->IO).KeyShift | 1) + 1;
    }
    pIVar39->FocusRequestNextCounterTabStop = iVar20;
    pIVar39->FocusRequestCurrCounterRegular = 0x7fffffff;
    pIVar39->FocusRequestCurrCounterTabStop = 0x7fffffff;
    pIVar39->FocusRequestCurrWindow = pIVar22;
LAB_0011c52f:
    if ((pIVar39->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar20 = (pIVar22->DC).FocusCounterTabStop, iVar20 != -1)) {
      pIVar39->FocusRequestCurrCounterTabStop =
           (pIVar39->FocusRequestNextCounterTabStop + iVar20 + 1) % (iVar20 + 1);
    }
    pIVar39->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar39->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar39->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar39->NavIdTabCounter = 0x7fffffff;
  fVar47 = 3.4028235e+38;
  if ((pIVar14->GcCompactAll == false) &&
     (fVar55 = (pIVar14->IO).ConfigMemoryCompactTimer, 0.0 <= fVar55)) {
    fVar47 = (float)pIVar14->Time - fVar55;
  }
  uVar17 = (pIVar14->Windows).Size;
  if (uVar17 != 0) {
    uVar21 = 0;
    do {
      pIVar22 = (pIVar14->Windows).Data[uVar21];
      bVar42 = pIVar22->Active;
      pIVar22->WasActive = bVar42;
      pIVar22->BeginCount = 0;
      pIVar22->Active = false;
      pIVar22->WriteAccessed = false;
      if (((bVar42 == false) && (pIVar22->MemoryCompacted == false)) &&
         (pIVar22->LastTimeActive <= fVar47 && fVar47 != pIVar22->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar22);
        uVar17 = (pIVar14->Windows).Size;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar17);
  }
  iVar20 = (pIVar14->TablesLastTimeActive).Size;
  if (0 < iVar20) {
    lVar37 = 0;
    lVar36 = 0;
    do {
      fVar55 = (pIVar14->TablesLastTimeActive).Data[lVar36];
      if ((0.0 <= fVar55) && (fVar55 < fVar47)) {
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar14->Tables).Buf.Data)->ID + lVar37));
        iVar20 = (pIVar14->TablesLastTimeActive).Size;
      }
      lVar36 = lVar36 + 1;
      lVar37 = lVar37 + 600;
    } while (lVar36 < iVar20);
  }
  if (pIVar14->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar14->GcCompactAll = false;
  if ((pIVar14->NavWindow != (ImGuiWindow *)0x0) && (pIVar14->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar14->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar14->CurrentWindowStack).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar9,(long)(pIVar14->CurrentWindowStack).Size << 3);
      ppIVar9 = (pIVar14->CurrentWindowStack).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar25 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar25 = *piVar25 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar14->CurrentWindowStack).Data = __dest_00;
    (pIVar14->CurrentWindowStack).Capacity = 0;
  }
  (pIVar14->CurrentWindowStack).Size = 0;
  if ((pIVar14->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar10 = (pIVar14->BeginPopupStack).Data;
    if (pIVar10 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar10,(long)(pIVar14->BeginPopupStack).Size * 0x30);
      pIVar10 = (pIVar14->BeginPopupStack).Data;
      if ((pIVar10 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar25 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar25 = *piVar25 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar14->BeginPopupStack).Data = __dest_01;
    (pIVar14->BeginPopupStack).Capacity = 0;
  }
  (pIVar14->BeginPopupStack).Size = 0;
  iVar20 = (pIVar14->ItemFlagsStack).Capacity;
  if (iVar20 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    piVar24 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar25 = (pIVar14->ItemFlagsStack).Data;
    if (piVar25 != (int *)0x0) {
      memcpy(piVar24,piVar25,(long)(pIVar14->ItemFlagsStack).Size << 2);
      piVar25 = (pIVar14->ItemFlagsStack).Data;
      if ((piVar25 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar25,GImAllocatorUserData);
    }
    (pIVar14->ItemFlagsStack).Data = piVar24;
    (pIVar14->ItemFlagsStack).Size = 0;
    (pIVar14->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar14->ItemFlagsStack).Size = 0;
    if (iVar20 != 0) {
      piVar25 = (pIVar14->ItemFlagsStack).Data;
      lVar37 = 0;
      goto LAB_0011c8e8;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar25 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar25 = *piVar25 + 1;
  }
  piVar25 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar24 = (pIVar14->ItemFlagsStack).Data;
  if (piVar24 != (int *)0x0) {
    memcpy(piVar25,piVar24,(long)(pIVar14->ItemFlagsStack).Size << 2);
    piVar24 = (pIVar14->ItemFlagsStack).Data;
    if ((piVar24 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar24,GImAllocatorUserData);
  }
  (pIVar14->ItemFlagsStack).Data = piVar25;
  (pIVar14->ItemFlagsStack).Capacity = 8;
  lVar37 = (long)(pIVar14->ItemFlagsStack).Size;
LAB_0011c8e8:
  piVar25[lVar37] = 0;
  (pIVar14->ItemFlagsStack).Size = (pIVar14->ItemFlagsStack).Size + 1;
  if ((pIVar14->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar25 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar25 = *piVar25 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar11 = (pIVar14->GroupStack).Data;
    if (pIVar11 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar11,(long)(pIVar14->GroupStack).Size * 0x30);
      pIVar11 = (pIVar14->GroupStack).Data;
      if ((pIVar11 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar25 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar25 = *piVar25 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
    }
    (pIVar14->GroupStack).Data = __dest_02;
    (pIVar14->GroupStack).Capacity = 0;
  }
  (pIVar14->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar14->NavWindow,false);
  pIVar39 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar39->DebugItemPickerActive == true) {
    uVar17 = pIVar39->HoveredIdPreviousFrame;
    pIVar39->MouseCursor = 7;
    iVar20 = (pIVar39->IO).KeyMap[0xe];
    if ((-1 < iVar20) && (bVar42 = IsKeyPressed(iVar20,true), bVar42)) {
      pIVar39->DebugItemPickerActive = false;
    }
    fVar47 = (pIVar39->IO).MouseDownDuration[0];
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      uVar46 = (uint)(uVar17 == 0);
    }
    else if (uVar17 == 0) {
      uVar46 = 1;
    }
    else {
      pIVar39->DebugItemPickerBreakId = uVar17;
      pIVar39->DebugItemPickerActive = false;
      uVar46 = 0;
    }
    *(byte *)&(pIVar39->NextWindowData).Flags = (byte)(pIVar39->NextWindowData).Flags | 0x40;
    (pIVar39->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar17);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar46 << 4)),
                "Click to break in debugger!");
    End();
    pIVar39 = GImGui;
  }
  pIVar14->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar39->NextWindowData).Flags = (byte)(pIVar39->NextWindowData).Flags | 2;
  (pIVar39->NextWindowData).SizeVal.x = 400.0;
  (pIVar39->NextWindowData).SizeVal.y = 400.0;
  (pIVar39->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  iVar20 = (pIVar14->Hooks).Size;
  if (0 < iVar20) {
    lVar37 = 0;
    lVar36 = 0;
    do {
      pIVar5 = (pIVar14->Hooks).Data;
      if (*(int *)(pIVar5 + lVar37 + 4) == 1) {
        (**(code **)(pIVar5 + lVar37 + 0x10))(pIVar14,pIVar5 + lVar37);
        iVar20 = (pIVar14->Hooks).Size;
      }
      lVar36 = lVar36 + 1;
      lVar37 = lVar37 + 0x20;
    } while (lVar36 < iVar20);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}